

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

void gguf_set_kv(gguf_context *ctx,gguf_context *src)

{
  gguf_type gVar1;
  gguf_type *pgVar2;
  reference ppcVar3;
  long in_RSI;
  gguf_context *in_RDI;
  size_t j;
  vector<const_char_*,_std::allocator<const_char_*>_> tmp;
  size_t ne;
  gguf_kv *kv;
  int64_t i;
  int64_t n_kv;
  string *in_stack_fffffffffffffe98;
  gguf_kv *in_stack_fffffffffffffea0;
  gguf_kv *in_stack_fffffffffffffea8;
  vector<const_char_*,_std::allocator<const_char_*>_> *this;
  gguf_context *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  gguf_context *in_stack_fffffffffffffee0;
  size_t in_stack_ffffffffffffff08;
  gguf_context *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  gguf_context *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  gguf_context *in_stack_ffffffffffffff30;
  gguf_kv *local_68;
  undefined1 local_49 [25];
  gguf_kv *local_30;
  gguf_kv *local_28;
  size_type local_20;
  long local_18;
  long local_10;
  gguf_context *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = gguf_get_n_kv((gguf_context *)0x1913e4);
  local_20 = 0;
  do {
    if (local_18 <= (long)local_20) {
      return;
    }
    local_28 = std::vector<gguf_kv,_std::allocator<gguf_kv>_>::operator[]
                         ((vector<gguf_kv,_std::allocator<gguf_kv>_> *)(local_10 + 8),local_20);
    if ((local_28->is_array & 1U) == 0) {
      pgVar2 = gguf_kv::get_type(local_28);
      switch(*pgVar2) {
      case GGUF_TYPE_UINT8:
        gguf_kv::get_key_abi_cxx11_(local_28);
        std::__cxx11::string::c_str();
        gguf_kv::get_val<unsigned_char>(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98)
        ;
        gguf_set_val_u8(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                        (uint8_t)((ulong)in_stack_fffffffffffffed0 >> 0x38));
        break;
      case GGUF_TYPE_INT8:
        gguf_kv::get_key_abi_cxx11_(local_28);
        std::__cxx11::string::c_str();
        gguf_kv::get_val<signed_char>(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
        gguf_set_val_i8(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                        (int8_t)((ulong)in_stack_fffffffffffffed0 >> 0x38));
        break;
      case GGUF_TYPE_UINT16:
        gguf_kv::get_key_abi_cxx11_(local_28);
        std::__cxx11::string::c_str();
        gguf_kv::get_val<unsigned_short>
                  (in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
        gguf_set_val_u16(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                         (uint16_t)((ulong)in_stack_fffffffffffffed0 >> 0x30));
        break;
      case GGUF_TYPE_INT16:
        gguf_kv::get_key_abi_cxx11_(local_28);
        std::__cxx11::string::c_str();
        gguf_kv::get_val<short>(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
        gguf_set_val_i16(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                         (int16_t)((ulong)in_stack_fffffffffffffed0 >> 0x30));
        break;
      case GGUF_TYPE_UINT32:
        gguf_kv::get_key_abi_cxx11_(local_28);
        std::__cxx11::string::c_str();
        gguf_kv::get_val<unsigned_int>(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
        gguf_set_val_u32(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                         (uint32_t)((ulong)in_stack_fffffffffffffed0 >> 0x20));
        break;
      case GGUF_TYPE_INT32:
        in_stack_ffffffffffffff30 = local_8;
        gguf_kv::get_key_abi_cxx11_(local_28);
        std::__cxx11::string::c_str();
        gguf_kv::get_val<int>(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
        gguf_set_val_i32(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                         (int32_t)((ulong)in_stack_fffffffffffffed0 >> 0x20));
        break;
      case GGUF_TYPE_FLOAT32:
        in_stack_ffffffffffffff20 = local_8;
        gguf_kv::get_key_abi_cxx11_(local_28);
        in_stack_ffffffffffffff28 = (char *)std::__cxx11::string::c_str();
        gguf_kv::get_val<float>(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
        gguf_set_val_f32(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                         (float)((ulong)in_stack_fffffffffffffed0 >> 0x20));
        break;
      case GGUF_TYPE_BOOL:
        in_stack_fffffffffffffee0 = local_8;
        gguf_kv::get_key_abi_cxx11_(local_28);
        std::__cxx11::string::c_str();
        gguf_kv::get_val<bool>(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
        gguf_set_val_bool(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                          SUB81((ulong)in_stack_fffffffffffffed0 >> 0x38,0));
        break;
      case GGUF_TYPE_STRING:
        in_stack_fffffffffffffed0 = local_8;
        gguf_kv::get_key_abi_cxx11_(local_28);
        in_stack_fffffffffffffed8 = (char *)std::__cxx11::string::c_str();
        gguf_kv::get_val<std::__cxx11::string>
                  (in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
        std::__cxx11::string::c_str();
        gguf_set_val_str(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                         (char *)in_stack_ffffffffffffff10);
        break;
      case GGUF_TYPE_ARRAY:
      default:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
                   ,0x422,"invalid type");
      case GGUF_TYPE_UINT64:
        in_stack_ffffffffffffff10 = local_8;
        gguf_kv::get_key_abi_cxx11_(local_28);
        in_stack_ffffffffffffff18 = (char *)std::__cxx11::string::c_str();
        gguf_kv::get_val<unsigned_long>(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98)
        ;
        gguf_set_val_u64(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                         (uint64_t)in_stack_fffffffffffffed0);
        break;
      case GGUF_TYPE_INT64:
        gguf_kv::get_key_abi_cxx11_(local_28);
        in_stack_ffffffffffffff08 = std::__cxx11::string::c_str();
        gguf_kv::get_val<long>(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
        gguf_set_val_i64(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                         (int64_t)in_stack_fffffffffffffed0);
        break;
      case GGUF_TYPE_FLOAT64:
        gguf_kv::get_key_abi_cxx11_(local_28);
        std::__cxx11::string::c_str();
        gguf_kv::get_val<double>(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
        gguf_set_val_f64(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                         (double)in_stack_fffffffffffffed0);
      }
    }
    else {
      local_30 = (gguf_kv *)gguf_kv::get_ne(in_stack_fffffffffffffea8);
      pgVar2 = gguf_kv::get_type(local_28);
      gVar1 = *pgVar2;
      if (GGUF_TYPE_BOOL < gVar1) {
        if (gVar1 == GGUF_TYPE_STRING) {
          this = (vector<const_char_*,_std::allocator<const_char_*>_> *)local_49;
          in_stack_fffffffffffffea8 = local_30;
          std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0x1919a7);
          std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                    (this,(size_type)in_stack_fffffffffffffea8,
                     (allocator_type *)in_stack_fffffffffffffea0);
          std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)0x1919cd);
          for (local_68 = (gguf_kv *)0x0; local_68 < local_30;
              local_68 = (gguf_kv *)&(local_68->key).field_0x1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_28->data_string,(size_type)local_68);
            in_stack_fffffffffffffea0 = (gguf_kv *)std::__cxx11::string::c_str();
            ppcVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                                ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                 (local_49 + 1),(size_type)local_68);
            *ppcVar3 = (value_type)in_stack_fffffffffffffea0;
          }
          in_stack_fffffffffffffe98 = gguf_kv::get_key_abi_cxx11_(local_28);
          std::__cxx11::string::c_str();
          std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x191aa6);
          gguf_set_arr_str(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                           (char **)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                     in_stack_fffffffffffffea0);
          goto LAB_00191b11;
        }
        if ((gVar1 == GGUF_TYPE_ARRAY) || (2 < gVar1 - GGUF_TYPE_UINT64)) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
                     ,0x43f,"invalid type");
        }
      }
      gguf_kv::get_key_abi_cxx11_(local_28);
      std::__cxx11::string::c_str();
      gguf_kv::get_type(local_28);
      std::vector<signed_char,_std::allocator<signed_char>_>::data
                ((vector<signed_char,_std::allocator<signed_char>_> *)0x191965);
      gguf_set_arr_data(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                        (gguf_type)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                        in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
    }
LAB_00191b11:
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void gguf_set_kv(struct gguf_context * ctx, const struct gguf_context * src) {
    const int64_t n_kv = gguf_get_n_kv(src);
    for (int64_t i = 0; i < n_kv; ++i) {
        const struct gguf_kv & kv = src->kv[i];

        if (!kv.is_array) {
            switch (kv.get_type()) {
                case GGUF_TYPE_UINT8:   gguf_set_val_u8  (ctx, kv.get_key().c_str(), kv.get_val<uint8_t>());             break;
                case GGUF_TYPE_INT8:    gguf_set_val_i8  (ctx, kv.get_key().c_str(), kv.get_val<int8_t>());              break;
                case GGUF_TYPE_UINT16:  gguf_set_val_u16 (ctx, kv.get_key().c_str(), kv.get_val<uint16_t>());            break;
                case GGUF_TYPE_INT16:   gguf_set_val_i16 (ctx, kv.get_key().c_str(), kv.get_val<int16_t>());             break;
                case GGUF_TYPE_UINT32:  gguf_set_val_u32 (ctx, kv.get_key().c_str(), kv.get_val<uint32_t>());            break;
                case GGUF_TYPE_INT32:   gguf_set_val_i32 (ctx, kv.get_key().c_str(), kv.get_val<int32_t>());             break;
                case GGUF_TYPE_FLOAT32: gguf_set_val_f32 (ctx, kv.get_key().c_str(), kv.get_val<float>());               break;
                case GGUF_TYPE_UINT64:  gguf_set_val_u64 (ctx, kv.get_key().c_str(), kv.get_val<uint64_t>());            break;
                case GGUF_TYPE_INT64:   gguf_set_val_i64 (ctx, kv.get_key().c_str(), kv.get_val<int64_t>());             break;
                case GGUF_TYPE_FLOAT64: gguf_set_val_f64 (ctx, kv.get_key().c_str(), kv.get_val<double>());              break;
                case GGUF_TYPE_BOOL:    gguf_set_val_bool(ctx, kv.get_key().c_str(), kv.get_val<bool>());                break;
                case GGUF_TYPE_STRING:  gguf_set_val_str (ctx, kv.get_key().c_str(), kv.get_val<std::string>().c_str()); break;
                case GGUF_TYPE_ARRAY:
                default: GGML_ABORT("invalid type");
            }
            continue;
        }

        const size_t ne = kv.get_ne();

        switch (kv.get_type()) {
            case GGUF_TYPE_UINT8:
            case GGUF_TYPE_INT8:
            case GGUF_TYPE_UINT16:
            case GGUF_TYPE_INT16:
            case GGUF_TYPE_UINT32:
            case GGUF_TYPE_INT32:
            case GGUF_TYPE_FLOAT32:
            case GGUF_TYPE_UINT64:
            case GGUF_TYPE_INT64:
            case GGUF_TYPE_FLOAT64:
            case GGUF_TYPE_BOOL: {
                gguf_set_arr_data(ctx, kv.get_key().c_str(), kv.get_type(), kv.data.data(), ne);
            } break;
            case GGUF_TYPE_STRING: {
                std::vector<const char *> tmp(ne);
                for (size_t j = 0; j < ne; ++j) {
                    tmp[j] = kv.data_string[j].c_str();
                }
                gguf_set_arr_str(ctx, kv.get_key().c_str(), tmp.data(), ne);
            } break;
            case GGUF_TYPE_ARRAY:
            default: GGML_ABORT("invalid type");
        }
    }
}